

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::DeadReckoningParameter::SetQuatAxis(DeadReckoningParameter *this,Vector *QA)

{
  KFLOAT32 KVar1;
  
  KVar1 = Vector::GetX(QA);
  *(KFLOAT32 *)this->m_OtherParams = KVar1;
  KVar1 = Vector::GetY(QA);
  *(KFLOAT32 *)(this->m_OtherParams + 4) = KVar1;
  KVar1 = Vector::GetZ(QA);
  *(KFLOAT32 *)(this->m_OtherParams + 8) = KVar1;
  return;
}

Assistant:

void KDIS::DATA_TYPE::DeadReckoningParameter::SetQuatAxis( const Vector & QA )
{
    KFLOAT32 &x = *reinterpret_cast<KFLOAT32*>(&m_OtherParams[0]);
    KFLOAT32 &y = *reinterpret_cast<KFLOAT32*>(&m_OtherParams[0+sizeof(KFLOAT32)]);
    KFLOAT32 &z = *reinterpret_cast<KFLOAT32*>(&m_OtherParams[0+sizeof(KFLOAT32)*2]);

    x = QA.GetX();
    y = QA.GetY();
    z = QA.GetZ();
}